

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-path.c
# Opt level: O3

wchar_t find_path(player *p,loc_conflict start,loc_conflict dest,int16_t **step_dirs)

{
  chunk_conflict2 *pcVar1;
  loc_conflict grid;
  _Bool _Var2;
  _Bool _Var3;
  _Bool _Var4;
  int iVar5;
  uint uVar6;
  wchar_t wVar7;
  int iVar8;
  int ***pppiVar9;
  int **ppiVar10;
  priority_queue *qp;
  loc grid_00;
  size_t sVar11;
  size_t sVar12;
  loc_conflict lVar13;
  loc_conflict lVar14;
  wchar_t wVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  wchar_t wVar21;
  undefined1 auVar22 [16];
  uint uVar23;
  int16_t *local_d8;
  loc_conflict local_c8;
  loc_conflict local_c0;
  wchar_t local_b4;
  undefined4 local_b0;
  wchar_t local_ac;
  ulong local_a8;
  int16_t **local_a0;
  loc_conflict local_98;
  wchar_t local_8c;
  undefined1 local_88 [16];
  ulong local_70;
  wchar_t local_64;
  wchar_t local_60;
  wchar_t local_5c;
  pfdistances_patched local_58;
  
  if (((p->cave != (chunk_conflict2 *)0x0) &&
      (_Var2 = square_in_bounds((chunk_conflict *)p->cave,(loc)start), _Var2)) &&
     (_Var2 = square_in_bounds((chunk_conflict *)p->cave,(loc)dest), _Var2)) {
    _Var2 = loc_eq(start,dest);
    if (_Var2) {
      wVar7 = L'\0';
      goto LAB_001a63e9;
    }
    _Var2 = square_isknown((chunk_conflict *)p->cave,(loc)start);
    if (_Var2) {
      _Var2 = square_isknown((chunk_conflict *)p->cave,(loc)dest);
    }
    else {
      _Var2 = false;
    }
    _Var3 = is_valid_pf(p,dest,_Var2,true);
    if ((_Var3) || (_Var4 = is_valid_pf(p,dest,_Var2,false), _Var4)) {
      local_a0 = step_dirs;
      local_5c = convert_turn_penalty(L'\x10',p);
      local_60 = compute_locked_penalty(p);
      local_64 = compute_rubble_penalty(p);
      pcVar1 = p->cave;
      local_58.height = pcVar1->height;
      local_58.width = pcVar1->width;
      auVar22._0_4_ = -(uint)(L'\0' < local_58.height);
      auVar22._4_4_ = -(uint)(L'\0' < local_58.height);
      auVar22._8_4_ = -(uint)(L'\0' < local_58.width);
      auVar22._12_4_ = -(uint)(L'\0' < local_58.width);
      iVar5 = movmskpd((int)pcVar1,auVar22);
      if (iVar5 != 3) {
        __assert_fail("height > 0 && width > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-path.c"
                      ,0x25c,
                      "void initialize_patched_distances(struct pfdistances_patched *, int, int)");
      }
      local_70 = (ulong)start >> 0x20;
      local_a8 = (ulong)dest >> 0x20;
      local_58.patch_size = L'\x10';
      local_58.patch_shift = L'\x04';
      local_58.patch_mask = L'\x0f';
      uVar23 = (((uint)local_58.height >> 4) - (uint)((local_58.height & 0xfU) == 0)) + 1;
      local_88._0_8_ =
           CONCAT44((((uint)local_58.width >> 4) - (uint)((local_58.width & 0xfU) == 0)) + 1,uVar23)
      ;
      local_88._8_8_ = 0;
      local_98 = start;
      local_58._20_8_ = local_88._0_8_;
      pppiVar9 = (int ***)mem_alloc((ulong)(uVar23 * 8));
      local_58.patches = pppiVar9;
      if (uVar23 != 0) {
        uVar16 = local_88._4_4_ << 3;
        uVar17 = 0;
        do {
          ppiVar10 = (int **)mem_zalloc((ulong)uVar16);
          pppiVar9[uVar17] = ppiVar10;
          uVar17 = uVar17 + 1;
        } while (uVar23 != uVar17);
      }
      lVar13 = local_98;
      uVar16 = (int)local_70 - (int)local_a8;
      uVar23 = -uVar16;
      if (0 < (int)uVar16) {
        uVar23 = uVar16;
      }
      iVar19 = local_98.x;
      iVar5 = dest.x;
      uVar6 = iVar19 - iVar5;
      uVar16 = -uVar6;
      if (0 < (int)uVar6) {
        uVar16 = uVar6;
      }
      if (uVar16 < uVar23) {
        uVar16 = uVar23;
      }
      qp = qp_new((ulong)(uVar16 * 4 + 8));
      initialize_patch(&local_58,lVar13,p,_Var2,_Var3);
      set_patched_distance(&local_58,lVar13,L'\0');
      local_c0.x = iVar19;
LAB_001a5fda:
      local_b0 = 0;
LAB_001a5fe7:
      local_c0.y = (int)local_70;
      wVar7 = L'\0';
      do {
        local_88._0_4_ = wVar7 + L'\x10';
        local_b4 = L'\xffffffff';
        lVar18 = 0;
        local_ac = L'\xffffffff';
        do {
          lVar13.y = local_c0.y;
          lVar13.x = local_c0.x;
          grid_00 = (loc)loc_sum(lVar13,(loc_conflict)ddgrid_ddd[lVar18]);
          _Var4 = loc_eq((loc_conflict)grid_00,dest);
          lVar13 = local_98;
          if (_Var4) {
            iVar8 = (int)local_a8 - (int)local_70;
            iVar19 = -iVar8;
            if (0 < iVar8) {
              iVar19 = iVar8;
            }
            iVar5 = iVar5 - local_98.x;
            iVar8 = -iVar5;
            if (0 < iVar5) {
              iVar8 = iVar5;
            }
            local_d8 = (int16_t *)mem_alloc((ulong)((iVar8 + iVar19) * 2 + 4));
            _Var2 = loc_eq(dest,lVar13);
            uVar17 = 0;
            if (_Var2) goto LAB_001a65b5;
            local_a8 = (ulong)(iVar8 + iVar19 + 2);
            wVar7 = L'\x7fffffff';
            uVar17 = 0;
            local_c8 = dest;
            goto LAB_001a6477;
          }
          _Var4 = has_patched_distance(&local_58,(loc_conflict)grid_00);
          if (!_Var4) {
            initialize_patch(&local_58,(loc_conflict)grid_00,p,_Var2,_Var3);
          }
          wVar7 = get_patched_distance(&local_58,(loc_conflict)grid_00);
          if ((int)local_88._0_4_ < wVar7) {
            uVar16 = iVar5 - grid_00.x;
            uVar23 = -uVar16;
            if (0 < (int)uVar16) {
              uVar23 = uVar16;
            }
            uVar6 = (int)local_a8 - grid_00.y;
            uVar16 = -uVar6;
            if (0 < (int)uVar6) {
              uVar16 = uVar6;
            }
            if (uVar16 < uVar23) {
              uVar16 = uVar23;
            }
            if (uVar16 < 0x8000000) {
              wVar21 = uVar16 * 0x10 ^ 0x7fffffff;
              if ((int)local_88._0_4_ < wVar21) {
                _Var4 = square_isknown((chunk_conflict *)p->cave,grid_00);
                local_8c = L'\0';
                if ((_Var4) &&
                   (_Var4 = square_ispassable((chunk_conflict *)p->cave,grid_00), !_Var4)) {
                  _Var4 = square_iscloseddoor((chunk_conflict *)p->cave,grid_00);
                  if (_Var4) {
                    _Var4 = square_islockeddoor((chunk_conflict *)p->cave,grid_00);
                    wVar15 = local_5c;
                    if (_Var4) {
                      wVar15 = local_60;
                    }
                  }
                  else {
                    _Var4 = square_isrubble((chunk_conflict *)p->cave,grid_00);
                    wVar15 = L'\x7fffffff';
                    if (_Var4) {
                      wVar15 = local_64;
                    }
                  }
                  if ((wVar7 - wVar15 <= (int)local_88._0_4_) ||
                     (local_8c = wVar15, wVar21 - wVar15 <= (int)local_88._0_4_)) goto LAB_001a628f;
                }
                wVar7 = local_ac;
                if (L'\0' < local_ac) {
                  sVar12 = qp_len(qp);
                  sVar11 = qp_size(qp);
                  if (sVar12 == sVar11) {
                    sVar12 = qp_size(qp);
                    if (sVar12 == 0) {
                      __assert_fail("qp_size(pending) > 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-path.c"
                                    ,0x4e1,
                                    "int find_path(struct player *, struct loc, struct loc, int16_t **)"
                                   );
                    }
                    sVar12 = qp_size(qp);
                    if ((long)sVar12 < 0) {
LAB_001a6612:
                      release_patched_distances(&local_58);
                      qp_free(qp,(_func_void_void_ptr *)0x0);
                      if (local_a0 == (int16_t **)0x0) {
                        return L'\xffffffff';
                      }
                      *local_a0 = (int16_t *)0x0;
                      return L'\xffffffff';
                    }
                    sVar12 = qp_size(qp);
                    _Var4 = qp_resize(qp,sVar12 * 2,(_func_void_void_ptr *)0x0);
                    if (_Var4) goto LAB_001a6612;
                  }
                  qp_push_int(qp,local_b4,wVar7);
                }
                local_ac = grid_to_i((loc_conflict)grid_00,p->cave->width);
                wVar7 = local_8c + local_88._0_4_;
                set_patched_distance(&local_58,(loc_conflict)grid_00,wVar7);
                local_b4 = uVar16 * 0x10 + wVar7;
              }
            }
          }
          else if ((_Var3 != false) &&
                  (_Var4 = square_isknown((chunk_conflict *)p->cave,grid_00), _Var4)) {
            _Var4 = square_isvisibletrap((chunk_conflict *)p->cave,grid_00);
            local_b0 = CONCAT31((int3)((uint)local_b0 >> 8),(byte)local_b0 | _Var4);
          }
LAB_001a628f:
          lVar18 = lVar18 + 1;
        } while (lVar18 != 8);
        if (local_ac < L'\0') {
          sVar12 = qp_len(qp);
          lVar13 = local_98;
          if (sVar12 == 0) goto LAB_001a6314;
          wVar7 = qp_pop_int(qp);
        }
        else {
          wVar7 = qp_pushpop_int(qp,local_b4,local_ac);
        }
        i_to_grid(wVar7,p->cave->width,&local_c0);
        lVar14.y = local_c0.y;
        lVar14.x = local_c0.x;
        _Var4 = has_patched_distance(&local_58,lVar14);
        if (!_Var4) {
          __assert_fail("has_patched_distance(&distances, next)",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-path.c"
                        ,0x534,"int find_path(struct player *, struct loc, struct loc, int16_t **)")
          ;
        }
        grid.y = local_c0.y;
        grid.x = local_c0.x;
        wVar7 = get_patched_distance(&local_58,grid);
      } while( true );
    }
  }
  wVar7 = L'\xffffffff';
LAB_001a63e9:
  if (step_dirs == (int16_t **)0x0) {
    return wVar7;
  }
  *step_dirs = (int16_t *)0x0;
  return wVar7;
LAB_001a6314:
  if (((_Var3 == false) || (_Var3 = player_is_trapsafe(p), _Var3)) ||
     ((((byte)local_b0 ^ 1) & 1) != 0)) goto LAB_001a6371;
  clear_patched_distances(&local_58);
  _Var3 = false;
  initialize_patch(&local_58,lVar13,p,_Var2,false);
  set_patched_distance(&local_58,lVar13,L'\0');
  local_c0.x = lVar13.x;
  goto LAB_001a5fe7;
LAB_001a6371:
  if (_Var2 == false) {
    release_patched_distances(&local_58);
    qp_free(qp,(_func_void_void_ptr *)0x0);
    if (local_a0 != (int16_t **)0x0) {
      *local_a0 = (int16_t *)0x0;
    }
    return L'\xffffffff';
  }
  _Var2 = false;
  _Var3 = is_valid_pf(p,dest,false,true);
  clear_patched_distances(&local_58);
  lVar13 = local_98;
  initialize_patch(&local_58,local_98,p,false,_Var3);
  set_patched_distance(&local_58,lVar13,L'\0');
  local_c0.x = lVar13.x;
  goto LAB_001a5fda;
LAB_001a6477:
  do {
    local_88._0_4_ = 0xffffffff;
    lVar13 = loc(-1,-1);
    uVar20 = (ulong)lVar13 >> 0x20;
    lVar18 = 0;
    do {
      lVar14 = loc_sum(local_c8,(loc_conflict)ddgrid_ddd[lVar18]);
      _Var2 = has_patched_distance(&local_58,lVar14);
      if ((_Var2) &&
         (wVar21 = get_patched_distance(&local_58,lVar14), wVar21 < wVar7 && L'\xffffffff' < wVar21)
         ) {
        uVar20 = (ulong)lVar14 >> 0x20;
        lVar13 = (loc_conflict)((ulong)lVar14 & 0xffffffff);
        local_88._0_4_ = (int)lVar18;
        wVar7 = wVar21;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 != 8);
    if ((int)local_88._0_4_ < 0) {
      __assert_fail("best_k >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-path.c"
                    ,0x309,
                    "int patched_distances_to_path(const struct pfdistances_patched *, struct loc, struct loc, int16_t **)"
                   );
    }
    if (((((wchar_t)uVar20 < L'\0') || (local_58.height <= (wchar_t)uVar20)) || (lVar13.x < L'\0'))
       || (local_58.width <= lVar13.x)) {
      __assert_fail("best_grid.y >= 0 && best_grid.y < distances->height && best_grid.x >= 0 && best_grid.x < distances->width"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-path.c"
                    ,0x30b,
                    "int patched_distances_to_path(const struct pfdistances_patched *, struct loc, struct loc, int16_t **)"
                   );
    }
    iVar5 = (int)local_a8;
    if ((long)iVar5 < (long)uVar17) {
      __assert_fail("length <= allocated && allocated > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-path.c"
                    ,0x30d,
                    "int patched_distances_to_path(const struct pfdistances_patched *, struct loc, struct loc, int16_t **)"
                   );
    }
    if (uVar17 == (local_a8 & 0xffffffff)) {
      if (0x3fffffff < iVar5) {
        mem_free(local_d8);
        wVar7 = L'\xffffffff';
        if (local_a0 != (int16_t **)0x0) {
          *local_a0 = (int16_t *)0x0;
        }
        goto LAB_001a65f6;
      }
      local_d8 = (int16_t *)mem_realloc(local_d8,(ulong)(uint)(iVar5 << 2));
      local_a8 = (ulong)(uint)(iVar5 * 2);
    }
    local_d8[uVar17] = 10 - ddd[(uint)local_88._0_4_];
    uVar17 = uVar17 + 1;
    local_c8 = (loc_conflict)((ulong)lVar13 & 0xffffffff | uVar20 << 0x20);
    _Var2 = loc_eq(local_c8,local_98);
  } while (!_Var2);
LAB_001a65b5:
  wVar7 = (wchar_t)uVar17;
  if (local_a0 == (int16_t **)0x0) {
    mem_free(local_d8);
  }
  else {
    *local_a0 = local_d8;
  }
LAB_001a65f6:
  release_patched_distances(&local_58);
  qp_free(qp,(_func_void_void_ptr *)0x0);
  return wVar7;
}

Assistant:

int find_path(struct player *p, struct loc start, struct loc dest,
		int16_t **step_dirs)
{
	/*
	 * Store the grid at the head of the path in the queue and have
	 * separate storage for a distance array.  Initialize that distance
	 * array in patches of patch_size by patch_size to limit overhead from
	 * parts of the cave that are not traversed when moving to the
	 * destination.
	 */
	struct pfdistances_patched distances;
	struct priority_queue *pending;
	struct loc next;
	int dist_next;
	int unlocked_penalty, locked_penalty, rubble_penalty;
	bool only_known, forbid_traps, hit_trap;

	if (!p->cave || !square_in_bounds(p->cave, start)
			|| !square_in_bounds(p->cave, dest)) {
		if (step_dirs) {
			*step_dirs = NULL;
		}
		return -1;
	}

	if (loc_eq(start, dest)) {
		if (step_dirs) {
			*step_dirs = NULL;
		}
		return 0;
	}

	/*
	 * If both the starting point and destination are remembered grids,
	 * first try paths that only traverse remembered grids.  If there are
	 * no such paths, then try ones that can include grids that are not
	 * remembered.
	 */
	only_known = square_isknown(p->cave, start)
		&& square_isknown(p->cave, dest);
	/*
	 * First try paths that do not go through grids with known visible
	 * traps.  If there are no such paths, then try paths that include
	 * known visible traps.
	 */
	if (is_valid_pf(p, dest, only_known, true)) {
		forbid_traps = true;
	} else if (is_valid_pf(p, dest, only_known, false)) {
		forbid_traps = false;
	} else {
		/*
		 * The destination is not reachable because it contains
		 * known terrain that pathfinding can not traverse.
		 */
		if (step_dirs) {
			*step_dirs = NULL;
		}
		return -1;
	}
	/*
	 * Remember if the pathfinding would change because of a known visible
	 * trap.
	 */
	hit_trap = false;

	/* Precompute quantities to penalize traversing some terrain. */
	unlocked_penalty = compute_unlocked_penalty(p);
	locked_penalty = compute_locked_penalty(p);
	rubble_penalty = compute_rubble_penalty(p);

	initialize_patched_distances(&distances, p->cave->height,
		p->cave->width);

	/* Set up the priority queue of feasible paths to consider. */
	pending = qp_new(4 * (2 + MAX(ABS(start.y - dest.y),
		ABS(start.x - dest.x))));

	initialize_patch(&distances, start, p, only_known, forbid_traps);
	set_patched_distance(&distances, start, 0);
	next = start;
	dist_next = 0;
	while (1) {
		int add_grid = -1, add_priority = -1;
		/* This is the base distance to any neighbor. */
		int dist_this = dist_next + PF_SCL, i;

		/* Try the neighbors. */
		for (i = 0; i < 8; ++i) {
			struct loc this_grid = loc_sum(next, ddgrid_ddd[i]);
			int dist_stored, dist_remaining, penalty;

			if (loc_eq(this_grid, dest)) {
				/* Reached the destination. */
				int length = patched_distances_to_path(
					&distances, start, dest,
					step_dirs);

				release_patched_distances(&distances);
				qp_free(pending, NULL);
				return length;
			}

			if (!has_patched_distance(&distances, this_grid)) {
				initialize_patch(&distances, this_grid,
					p, only_known, forbid_traps);
			}
			dist_stored = get_patched_distance(&distances,
				this_grid);
			if (dist_stored <= dist_this) {
				/*
				 * Since it is unreachable or already has been
				 * visited by a path that is not longer than
				 * this one, do not need to consider it.  If
				 * not allowing traps and this grid is a known
				 * visible trap, remember that there is at
				 * least one trap that affects the pathfinding.
				 */
				if (forbid_traps && square_isknown(p->cave,
						this_grid)
						&& square_isvisibletrap(
						p->cave, this_grid)) {
					hit_trap = true;
				}
				continue;
			}

			/*
			 * Use A* pathfinding:  add an estimate (in this case
			 * the Chebyshev distance) to get from this_grid to
			 * the destination.
			 */
			dist_remaining = MAX(ABS(dest.x - this_grid.x),
				ABS(dest.y - this_grid.y));
			if (dist_remaining > INT_MAX / PF_SCL
					|| dist_this >= INT_MAX
					- PF_SCL * dist_remaining) {
				/*
				 * Can not reach the destination from this_grid
				 * in a reasonable number of turns, so skip
				 * it.
				 */
				continue;
			}
			dist_remaining *= PF_SCL;

			if (square_isknown(p->cave, this_grid)
					&& !square_ispassable(p->cave,
					this_grid)) {
				/*
				 * Penalize the distance for some known but
				 * impassable terrain.
				 */
				if (square_iscloseddoor(p->cave, this_grid)) {
					penalty = (square_islockeddoor(p->cave,
						this_grid)) ? locked_penalty :
						unlocked_penalty;
				} else if (square_isrubble(p->cave,
						this_grid)) {
					penalty = rubble_penalty;
				} else {
					/*
					 * Should not happen, treat it as
					 * completely impassable.
					 */
					penalty = INT_MAX;
				}

				if (dist_this >= dist_stored - penalty
						|| dist_this >= INT_MAX -
						penalty - dist_remaining) {
					/*
					 * The penalty makes this path
					 * no shorter than what has already
					 * reached this grid or puts the
					 * destination out of reach.  Skip it.
					 */
					continue;
				}
			} else {
				penalty = 0;
			}

			/* Push what is pending onto the queue. */
			if (add_grid > 0) {
				if (qp_len(pending) == qp_size(pending)) {
					assert(qp_size(pending) > 0);
					if (qp_size(pending) > SIZE_MAX / 2 ||
							qp_resize(pending, 2
							* qp_size(pending),
							NULL)) {
						/*
						 * Could not resize so give
						 * up.
						 */
						release_patched_distances(
							&distances);
						qp_free(pending, NULL);
						if (step_dirs) {
							*step_dirs = NULL;
						}
						return -1;
					}
				}
				qp_push_int(pending, add_priority, add_grid);
			}
			add_grid = grid_to_i(this_grid, p->cave->width);
			add_priority = dist_this + penalty + dist_remaining;
			set_patched_distance(&distances, this_grid,
				dist_this + penalty);
		}

		if (add_grid >= 0) {
			i_to_grid(qp_pushpop_int(pending, add_priority,
				add_grid), p->cave->width, &next);
		} else {
			if (qp_len(pending) == 0) {
				/*
				 * Exhausted possible paths without reaching
				 * the destination.
				 */
				if (forbid_traps && !player_is_trapsafe(p)
						&& hit_trap) {
					/*
					 * Retry but allow grids that contain
					 * known visible traps.
					 */
					forbid_traps = false;
					clear_patched_distances(&distances);
					initialize_patch(&distances, start,
						p, only_known, forbid_traps);
					set_patched_distance(&distances,
						start, 0);
					next = start;
					dist_next = 0;
					continue;
				}
				if (only_known) {
					/*
					 * Retry but allow grids that are not
					 * in the player's memory.
					 */
					only_known = false;
					if (is_valid_pf(p, dest, false, true)) {
						forbid_traps = true;
					} else {
						forbid_traps = false;
					}
					hit_trap = false;
					clear_patched_distances(&distances);
					initialize_patch(&distances, start,
						p, only_known, forbid_traps);
					set_patched_distance(&distances,
						start, 0);
					next = start;
					dist_next = 0;
					continue;
				}
				/* Nothing to retry so give up. */
				release_patched_distances(&distances);
				qp_free(pending, NULL);
				if (step_dirs) {
					*step_dirs = NULL;
				}
				return -1;
			}
			i_to_grid(qp_pop_int(pending), p->cave->width, &next);
		}
		/* The relevant patch should already have been initialized. */
		assert(has_patched_distance(&distances, next));
		dist_next = get_patched_distance(&distances, next);
	}
}